

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::AnalyzeFeatures(IRContext *this)

{
  FeatureManager *this_00;
  pointer this_01;
  Module *module;
  unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_10 = this;
  this_00 = (FeatureManager *)::operator_new(0x58);
  FeatureManager::FeatureManager(this_00,&this->grammar_);
  std::unique_ptr<spvtools::opt::FeatureManager,std::default_delete<spvtools::opt::FeatureManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::FeatureManager>,void>
            ((unique_ptr<spvtools::opt::FeatureManager,std::default_delete<spvtools::opt::FeatureManager>>
              *)&local_18,this_00);
  std::
  unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>::
  operator=(&this->feature_mgr_,&local_18);
  std::
  unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>::
  ~unique_ptr(&local_18);
  this_01 = std::
            unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
            ::operator->(&this->feature_mgr_);
  module = IRContext::module(this);
  FeatureManager::Analyze(this_01,module);
  return;
}

Assistant:

void AnalyzeFeatures() {
    feature_mgr_ =
        std::unique_ptr<FeatureManager>(new FeatureManager(grammar_));
    feature_mgr_->Analyze(module());
  }